

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

module * __thiscall
pybind11::module::
def<std::pair<std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>(*)(anurbs::CurveBase<2l>const&,double),pybind11::arg,pybind11::arg_v>
          (module *this,char *name_,
          _func_pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_CurveBase<2L>_ptr_double
          **f,arg *extra,arg_v *extra_1)

{
  _func_pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_CurveBase<2L>_ptr_double
  *f_00;
  handle local_58;
  cpp_function func;
  object local_48;
  scope local_40;
  name local_38;
  sibling local_30;
  
  f_00 = *f;
  local_40.value.m_ptr = (handle)(this->super_object).super_handle.m_ptr;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_38.value = name_;
  getattr((pybind11 *)&local_58,local_40.value,name_,(PyObject *)&_Py_NoneStruct);
  local_30.value.m_ptr = (handle)(handle)local_58.m_ptr;
  cpp_function::
  cpp_function<std::pair<std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>,anurbs::CurveBase<2l>const&,double,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg_v>
            (&func,f_00,&local_38,&local_40,&local_30,extra,extra_1);
  pybind11::object::~object((object *)&local_58);
  pybind11::object::~object(&local_48);
  add_object(this,name_,(handle)func.super_function.super_object.super_handle.m_ptr,true);
  pybind11::object::~object((object *)&func);
  return this;
}

Assistant:

module &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }